

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

TPZAutoPointer<TPZDohrSubstructCondense<double>_> * __thiscall
TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator=
          (TPZAutoPointer<TPZDohrSubstructCondense<double>_> *this,
          TPZAutoPointer<TPZDohrSubstructCondense<double>_> *copy)

{
  bool bVar1;
  long *in_RSI;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> *in_RDI;
  TPZReference *in_stack_00000008;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> *local_8;
  
  local_8 = in_RDI;
  if ((TPZReference *)*in_RSI != in_RDI->fRef) {
    if ((in_RDI->fRef != (TPZReference *)0x0) &&
       (bVar1 = TPZReference::Decrease(in_stack_00000008), bVar1)) {
      Release(in_RDI);
    }
    in_RDI->fRef = (TPZReference *)*in_RSI;
    TPZReference::Increment((TPZReference *)*in_RSI);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

TPZAutoPointer &operator=(const TPZAutoPointer<T> &copy)
	{
		if(copy.fRef == fRef) return *this;		
        else if (fRef && fRef->Decrease()){
            Release();
        }
		fRef = copy.fRef;
        copy.fRef->Increment();
        
		return *this;
	}